

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_packing.cpp
# Opt level: O0

size_type __thiscall
packing::AssignedProtos::combinedVolume<std::__detail::_Node_iterator<unsigned_short,true,false>>
          (AssignedProtos *this,_Node_iterator<unsigned_short,_true,_false> *begin,
          _Node_iterator<unsigned_short,_true,_false> *end)

{
  unordered_set<unsigned_short,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<unsigned_short>>
  *this_00;
  size_type sVar1;
  unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
  *colors;
  _Node_iterator<unsigned_short,_true,_false> *end_local;
  _Node_iterator<unsigned_short,_true,_false> *begin_local;
  AssignedProtos *this_local;
  
  this_00 = (unordered_set<unsigned_short,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<unsigned_short>>
             *)uniqueColors(this);
  std::
  unordered_set<unsigned_short,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<unsigned_short>>
  ::insert<std::__detail::_Node_iterator<unsigned_short,true,false>>
            (this_00,(_Node_iterator<unsigned_short,_true,_false>)
                     (begin->super__Node_iterator_base<unsigned_short,_false>)._M_cur,
             (_Node_iterator<unsigned_short,_true,_false>)
             (end->super__Node_iterator_base<unsigned_short,_false>)._M_cur);
  sVar1 = std::
          unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
          ::size((unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
                  *)this_00);
  return sVar1;
}

Assistant:

auto combinedVolume(Iter &&begin, Iter &&end) const {
		auto &colors = uniqueColors();
		colors.insert(std::forward<Iter>(begin), std::forward<Iter>(end));
		return colors.size();
	}